

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool __thiscall bssl::Array<int>::InitUninitialized(Array<int> *this,size_t new_size)

{
  int *piVar1;
  bool bVar2;
  
  OPENSSL_free(this->data_);
  this->data_ = (int *)0x0;
  this->size_ = 0;
  bVar2 = true;
  if (new_size != 0) {
    if (new_size >> 0x3e == 0) {
      piVar1 = (int *)OPENSSL_malloc(new_size * 4);
      this->data_ = piVar1;
      if (piVar1 == (int *)0x0) {
        bVar2 = false;
      }
      else {
        this->size_ = new_size;
      }
    }
    else {
      bVar2 = false;
      ERR_put_error(0xe,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                    ,0xd5);
    }
  }
  return bVar2;
}

Assistant:

bool InitUninitialized(size_t new_size) {
    Reset();
    if (new_size == 0) {
      return true;
    }

    if (new_size > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    data_ = reinterpret_cast<T *>(OPENSSL_malloc(new_size * sizeof(T)));
    if (data_ == nullptr) {
      return false;
    }
    size_ = new_size;
    return true;
  }